

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFraigRestore(int nPatsRand,int nPatsDyna,int nBTLimit)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *vStore;
  void **ppvVar5;
  Abc_Ntk_t *pAVar6;
  int iVar7;
  void *pvVar8;
  Fraig_Params_t Params;
  Fraig_Params_t local_70;
  
  vStore = Abc_FrameReadStore();
  iVar7 = vStore->nSize;
  if (iVar7 == 0) {
    puts("There are no network currently in storage.");
    return (Abc_Ntk_t *)0x0;
  }
  if (iVar7 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar5 = vStore->pArray;
  pvVar8 = *ppvVar5;
  if (iVar7 == 1) goto LAB_002c7e0c;
  uVar3 = iVar7 - 1;
  vStore->nSize = uVar3;
  pvVar2 = ppvVar5[uVar3];
  uVar1 = vStore->nCap;
  if (uVar3 == uVar1) {
    if ((int)uVar1 < 0x10) {
      ppvVar5 = (void **)realloc(ppvVar5,0x80);
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar1 * 2;
      if (iVar7 <= (int)uVar1) goto LAB_002c7de9;
      ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar1 << 4);
    }
    vStore->pArray = ppvVar5;
    vStore->nCap = iVar7;
  }
LAB_002c7de9:
  iVar7 = vStore->nSize;
  vStore->nSize = iVar7 + 1;
  vStore->pArray[iVar7] = pvVar8;
  if ((long)iVar7 < 0) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  *vStore->pArray = pvVar2;
  pvVar8 = pvVar2;
LAB_002c7e0c:
  iVar4 = (int)(0x8000000 /
               (long)(*(int *)(*(long *)((long)pvVar8 + 0x38) + 4) + *(int *)((long)pvVar8 + 0x7c)))
  ;
  iVar7 = 0x20;
  if (iVar4 < 0x20) {
    iVar7 = iVar4;
  }
  Fraig_ParamsSetDefault(&local_70);
  local_70.nPatsRand = nPatsRand;
  if (nPatsRand == 0) {
    local_70.nPatsRand = iVar7 << 5;
  }
  local_70.nPatsDyna = iVar7 << 5;
  if (nPatsDyna != 0) {
    local_70.nPatsDyna = nPatsDyna;
  }
  local_70.fFuncRed = 1;
  local_70.fFeedBack = 1;
  local_70.fDist1Pats = 1;
  local_70.fDoSparse = 1;
  local_70.fChoicing = 1;
  local_70.fTryProve = 0;
  local_70.fInternal = 1;
  local_70.fVerbose = 0;
  local_70.nBTLimit = nBTLimit;
  pAVar6 = Abc_NtkFraigPartitioned(vStore,&local_70);
  Abc_NtkFraigStoreClean();
  return pAVar6;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraigRestore( int nPatsRand, int nPatsDyna, int nBTLimit )
{
    extern Abc_Ntk_t * Abc_NtkFraigPartitioned( Vec_Ptr_t * vStore, void * pParams );
    Fraig_Params_t Params;
    Vec_Ptr_t * vStore;
    Abc_Ntk_t * pNtk, * pFraig;
    int nWords1, nWords2, nWordsMin;
//    abctime clk = Abc_Clock();

    // get the stored network
    vStore = Abc_FrameReadStore();
    if ( Vec_PtrSize(vStore) == 0 )
    {
        printf( "There are no network currently in storage.\n" );
        return NULL;
    }
//    printf( "Currently stored %d networks will be fraiged.\n", Vec_PtrSize(vStore) );
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( vStore, 0 );

    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    if ( Vec_PtrSize(vStore) > 1 )
    {
        pNtk = (Abc_Ntk_t *)Vec_PtrPop( vStore );
        Vec_PtrPush( vStore, Vec_PtrEntry(vStore,0) );
        Vec_PtrWriteEntry( vStore, 0, pNtk );
    }

    // to determine the number of simulation patterns
    // use the following strategy
    // at least 64 words (32 words random and 32 words dynamic)
    // no more than 256M for one circuit (128M + 128M)
    nWords1 = 32;
    nWords2 = (1<<27) / (Abc_NtkNodeNum(pNtk) + Abc_NtkCiNum(pNtk));
    nWordsMin = Abc_MinInt( nWords1, nWords2 );

    // set parameters for fraiging
    Fraig_ParamsSetDefault( &Params );
    Params.nPatsRand  = nPatsRand ? nPatsRand : nWordsMin * 32;    // the number of words of random simulation info
    Params.nPatsDyna  = nPatsDyna ? nPatsDyna : nWordsMin * 32;    // the number of words of dynamic simulation info
    Params.nBTLimit   = nBTLimit;          // the max number of backtracks to perform
    Params.fFuncRed   =    1;              // performs only one level hashing
    Params.fFeedBack  =    1;              // enables solver feedback
    Params.fDist1Pats =    1;              // enables distance-1 patterns
    Params.fDoSparse  =    1;              // performs equiv tests for sparse functions 
    Params.fChoicing  =    1;              // enables recording structural choices
    Params.fTryProve  =    0;              // tries to solve the final miter
    Params.fInternal  =    1;              // does not show progress bar
    Params.fVerbose   =    0;              // the verbosiness flag

    // perform partitioned computation of structural choices
    pFraig = Abc_NtkFraigPartitioned( vStore, &Params );
    Abc_NtkFraigStoreClean();
//ABC_PRT( "Total choicing time", Abc_Clock() - clk );
    return pFraig;
}